

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractanimation.cpp
# Opt level: O0

void __thiscall QUnifiedTimer::~QUnifiedTimer(QUnifiedTimer *this)

{
  QBasicTimer *in_RDI;
  QDefaultAnimationDriver *in_stack_00000030;
  QObject *in_stack_00000108;
  
  *(undefined ***)in_RDI = &PTR_metaObject_00be9068;
  QList<QAbstractAnimationTimer_*>::~QList((QList<QAbstractAnimationTimer_*> *)0x668471);
  QList<QAbstractAnimationTimer_*>::~QList((QList<QAbstractAnimationTimer_*> *)0x668482);
  QList<QAbstractAnimationTimer_*>::~QList((QList<QAbstractAnimationTimer_*> *)0x668490);
  QBasicTimer::~QBasicTimer(in_RDI);
  QDefaultAnimationDriver::~QDefaultAnimationDriver(in_stack_00000030);
  QObject::~QObject(in_stack_00000108);
  return;
}

Assistant:

QUnifiedTimer::~QUnifiedTimer()
    = default;